

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_EmbeddedFile HPDF_AttachFile(HPDF_Doc pdf,char *file)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  HPDF_String name_00;
  HPDF_PDFVer local_54;
  HPDF_STATUS ret;
  HPDF_Array af;
  HPDF_String name;
  HPDF_EmbeddedFile efile;
  HPDF_NameTree ntree;
  HPDF_NameDict names;
  char *file_local;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    return (HPDF_EmbeddedFile)0x0;
  }
  ntree = HPDF_Catalog_GetNames(pdf->catalog);
  if (ntree == (HPDF_NameDict)0x0) {
    ntree = HPDF_NameDict_New(pdf->mmgr,pdf->xref);
    if (ntree == (HPDF_NameDict)0x0) {
      return (HPDF_EmbeddedFile)0x0;
    }
    HVar2 = HPDF_Catalog_SetNames(pdf->catalog,ntree);
    if (HVar2 != 0) {
      return (HPDF_EmbeddedFile)0x0;
    }
  }
  efile = HPDF_NameDict_GetNameTree(ntree,HPDF_NAME_EMBEDDED_FILES);
  if (efile == (HPDF_NameTree)0x0) {
    efile = HPDF_NameTree_New(pdf->mmgr,pdf->xref);
    if (efile == (HPDF_NameTree)0x0) {
      return (HPDF_EmbeddedFile)0x0;
    }
    HVar2 = HPDF_NameDict_SetNameTree(ntree,HPDF_NAME_EMBEDDED_FILES,efile);
    if (HVar2 != 0) {
      return (HPDF_EmbeddedFile)0x0;
    }
  }
  pdf_local = (HPDF_Doc)HPDF_EmbeddedFile_New(pdf->mmgr,pdf->xref,file);
  if (pdf_local == (HPDF_Doc)0x0) {
    pdf_local = (HPDF_Doc)0x0;
  }
  else {
    name_00 = HPDF_String_New(pdf->mmgr,file,(HPDF_Encoder_conflict)0x0);
    if (name_00 == (HPDF_String)0x0) {
      pdf_local = (HPDF_Doc)0x0;
    }
    else {
      HVar2 = HPDF_NameTree_Add(efile,name_00,pdf_local);
      if (HVar2 == 0) {
        ret = (HPDF_STATUS)HPDF_Dict_GetItem(pdf->catalog,"AF",0x10);
        if ((void *)ret == (void *)0x0) {
          ret = (HPDF_STATUS)HPDF_Array_New(pdf->mmgr);
          if ((HPDF_Array)ret == (HPDF_Array)0x0) {
            return (HPDF_EmbeddedFile)0x0;
          }
          HPDF_Dict_Add(pdf->catalog,"AF",(void *)ret);
        }
        HPDF_Array_Add((HPDF_Array)ret,pdf_local);
        if (pdf->pdf_version < HPDF_VER_20) {
          local_54 = HPDF_VER_17;
        }
        else {
          local_54 = pdf->pdf_version;
        }
        pdf->pdf_version = local_54;
      }
      else {
        pdf_local = (HPDF_Doc)0x0;
      }
    }
  }
  return (HPDF_EmbeddedFile)pdf_local;
}

Assistant:

HPDF_EXPORT(HPDF_EmbeddedFile)
HPDF_AttachFile  (HPDF_Doc    pdf,
                  const char *file)
{
    HPDF_NameDict names;
    HPDF_NameTree ntree;
    HPDF_EmbeddedFile efile;
    HPDF_String name;
    HPDF_Array af;
    HPDF_STATUS ret = HPDF_OK;

    HPDF_PTRACE ((" HPDF_AttachFile\n"));

    if (!HPDF_HasDoc (pdf))
        return NULL;

    names = HPDF_Catalog_GetNames (pdf->catalog);
    if (!names) {
        names = HPDF_NameDict_New (pdf->mmgr, pdf->xref);
        if (!names)
            return NULL;

        ret = HPDF_Catalog_SetNames (pdf->catalog, names);
        if (ret != HPDF_OK)
            return NULL;
    }

    ntree = HPDF_NameDict_GetNameTree (names, HPDF_NAME_EMBEDDED_FILES);
    if (!ntree) {
        ntree = HPDF_NameTree_New (pdf->mmgr, pdf->xref);
        if (!ntree)
            return NULL;

        ret = HPDF_NameDict_SetNameTree (names, HPDF_NAME_EMBEDDED_FILES, ntree);
        if (ret != HPDF_OK)
            return NULL;
    }

    efile = HPDF_EmbeddedFile_New (pdf->mmgr, pdf->xref, file);
    if (!efile)
        return NULL;

    name = HPDF_String_New (pdf->mmgr, file, NULL);
    if (!name)
        return NULL;

    ret = HPDF_NameTree_Add (ntree, name, efile);
    if (ret != HPDF_OK)
        return NULL;

    af = HPDF_Dict_GetItem(pdf->catalog, "AF", HPDF_OCLASS_ARRAY);
    if (!af) {
        af = HPDF_Array_New(pdf->mmgr);
        if (!af)
            return NULL;
        HPDF_Dict_Add(pdf->catalog, "AF", af);
    }
    HPDF_Array_Add(af, efile);

    pdf->pdf_version = (pdf->pdf_version > HPDF_VER_17 ? pdf->pdf_version : HPDF_VER_17);
    return efile;
}